

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ulong *puVar4;
  SerialArena *this;
  __int_type_conflict3 _Var5;
  __pointer_type pSVar6;
  bool bVar7;
  uint uVar8;
  void *pvVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  long lVar10;
  Rep *pRVar11;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar12;
  ushort *p;
  string *s;
  ushort *ptr_00;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar13;
  string *psVar14;
  uint uVar15;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  uint uVar16;
  ulong uVar17;
  Arena *arena;
  ulong uVar18;
  uint *puVar19;
  uint64_t uVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  long *plVar21;
  string_view wire_bytes;
  string_view wire_bytes_00;
  pair<const_char_*,_int> pVar22;
  pair<const_char_*,_unsigned_int> pVar23;
  LogMessageFatal local_40 [16];
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  uVar8 = data.field_0._0_4_;
  if ((uVar8 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0029fdec;
  }
  uVar3 = *(ushort *)(table_00.data + 10);
  uVar16 = uVar3 & 0x1c0;
  uVar20 = hasbits;
  pvVar9 = MaybeGetSplitBase(msg,true,table);
  if (uVar16 != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_40,0x21,"Unsupported repeated string rep: ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_40,(unsigned_short)uVar16);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  plVar21 = (long *)((long)pvVar9 + (ulong)*(uint *)table_00);
  if (((ulong)plVar21 & 7) != 0) {
    AlignFail(plVar21);
  }
  uVar16 = uVar3 & 0x600;
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)*plVar21;
  if (this_00 == (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)kZeroBuffer) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (arena);
    *plVar21 = (long)this_00;
  }
  puVar4 = (ulong *)this_00[2].data;
  ptr_00 = (ushort *)ptr;
  if (puVar4 == (ulong *)0x0) {
LAB_0029fd14:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_01;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0029fe34;
      ptr_00 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar7 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar16,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_02;
      if (!bVar7) goto LAB_0029fe34;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0029fdfc;
      bVar1 = (byte)*(ushort *)ptr;
      uVar15 = (uint)bVar1;
      ptr_00 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)ptr_00;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar23 = ReadTagFallback(ptr,uVar15);
          uVar15 = pVar23.second;
          ptr_00 = (ushort *)pVar23.first;
        }
        else {
          ptr_00 = (ushort *)((long)ptr + 2);
        }
      }
    } while (uVar15 == uVar8);
  }
  else {
    lVar10 = __tls_get_addr(&PTR_004be9d0);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar10 + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar4) goto LAB_0029fd14;
    this = *(SerialArena **)(lVar10 + 0x10);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar15 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar11 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar15 = pRVar11->allocated_size;
    }
    p = (ushort *)ptr;
    if (uVar15 != *(uint *)(this_00 + 1)) goto LAB_0029fd14;
    do {
      bVar1 = (byte)*p;
      ptr_00 = (ushort *)(ulong)bVar1;
      uVar15 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar22 = ReadSizeFallback((char *)p,(uint)bVar1);
        ctx_00 = pVar22._8_8_;
        if ((ushort *)pVar22.first == (ushort *)0x0) {
LAB_0029fe34:
          pcVar13 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
          return pcVar13;
        }
        uVar15 = pVar22.second;
        ptr_00 = (ushort *)pVar22.first;
      }
      else {
        ptr_00 = (ushort *)((long)p + 1);
      }
      _Var5 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var5 == 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        uVar18 = _Var5 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar18;
        pSVar6 = (this->string_block_)._M_b._M_p;
        uVar17 = (ulong)pSVar6->allocated_size_ - 0x10;
        if (uVar17 < uVar18) {
          psVar14 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (uVar18,uVar17,"offset <= effective_size()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                     ,0xa2,*(undefined8 *)(psVar14 + 8),*(undefined8 *)psVar14);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)&pSVar6[-1].next_ + _Var5);
      }
      *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
      *(undefined8 *)((long)data.field_0 + 8) = 0;
      *(undefined1 *)((long)data.field_0 + 0x10) = 0;
      RepeatedPtrFieldBase::AddAllocatedForParse
                ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
      ptr = EpsCopyInputStream::ReadString
                      (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar15,(string *)data.field_0);
      ctx_00 = extraout_RDX;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0029fe34;
      pVVar12 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      ptr_00 = (ushort *)(pVVar12->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar7 = MpVerifyUtf8((TcParser *)pVVar12->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar16,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_00;
      if (!bVar7) goto LAB_0029fe34;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0029fdfc;
      bVar1 = (byte)*(ushort *)ptr;
      uVar15 = (uint)bVar1;
      p = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)p;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar23 = ReadTagFallback(ptr,uVar15);
          uVar15 = pVar23.second;
          p = (ushort *)pVar23.first;
        }
        else {
          p = (ushort *)((long)ptr + 2);
        }
      }
    } while (uVar15 == uVar8);
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_0029fdfc:
    if ((ulong)table->has_bits_offset != 0) {
      puVar19 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar19 & 3) != 0) {
        AlignFail();
      }
      *puVar19 = *puVar19 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar8 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar8 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar17 = (ulong)(uVar8 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar17 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar17);
LAB_0029fdec:
  pcVar13 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar13;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}